

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

int __thiscall
deqp::gls::BufferTestUtil::IndexArrayVerifier::verify
          (IndexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  pointer *this_00;
  pointer *this_01;
  allocator<tcu::Vector<float,_3>_> *this_02;
  RenderContext *pRVar1;
  TestLog *log;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 program;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference src;
  reference src_00;
  char *imageSetDesc_00;
  undefined8 extraout_RAX;
  int iVar9;
  int iVar10;
  int local_324;
  int local_274;
  int local_26c;
  int local_234;
  PixelBufferAccess local_230;
  PixelBufferAccess local_208;
  int local_1dc;
  string local_1d8;
  int local_1b4;
  string local_1b0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string imageSetDesc;
  int curOffset;
  int numBytesToVerify;
  bool isLeftoverBatch;
  int numRemaining;
  undefined1 local_f0 [3];
  bool isOk;
  int numVerified;
  Surface referenceImg;
  Surface indexBufferImg;
  undefined1 local_b8 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fetchedColor;
  allocator<tcu::Vector<float,_2>_> local_89;
  undefined1 local_88 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> fetchedPos;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> colors;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  RGBA threshold;
  int minBytesPerBatch;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  int numBytes_local;
  int offset_local;
  deUint8 *refPtr_local;
  deUint32 buffer_local;
  IndexArrayVerifier *this_local;
  
  iVar9 = (int)siglen;
  iVar10 = (int)tbs;
  iVar4 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[4])();
  iVar5 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar4));
  iVar5 = de::min<int>(0x80,iVar5);
  iVar4 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var,iVar4));
  iVar4 = de::min<int>(0x80,iVar4);
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  tcu::RGBA::RGBA((RGBA *)&positions.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0,0,0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
             &fetchedPos.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_89);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_88,0x81
             ,&local_89);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_89);
  this_02 = (allocator<tcu::Vector<float,_3>_> *)((long)&indexBufferImg.m_pixels.m_cap + 7);
  std::allocator<tcu::Vector<float,_3>_>::allocator(this_02);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_b8,0x81
             ,this_02);
  std::allocator<tcu::Vector<float,_3>_>::~allocator
            ((allocator<tcu::Vector<float,_3>_> *)((long)&indexBufferImg.m_pixels.m_cap + 7));
  tcu::Surface::Surface((Surface *)&referenceImg.m_pixels.m_cap,iVar5,iVar4);
  tcu::Surface::Surface((Surface *)local_f0,iVar5,iVar4);
  numRemaining = 0;
  isLeftoverBatch = true;
  computeIndexVerifierPositions
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  computeIndexVerifierColors
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
             &fetchedPos.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glBindBuffer(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x88eb,0)
  ;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8893,(GLuint)ctx);
  glu::CallLogWrapper::glViewport
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0,0,iVar5,iVar4);
  glu::CallLogWrapper::glClearColor
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0.0,0.0,0.0,1.0);
  program = glu::ShaderProgram::getProgram(this->m_program);
  glu::CallLogWrapper::glUseProgram(&(this->super_BufferVerifierBase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_posLoc);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_colorLoc);
  glu::CallLogWrapper::glEnable(&(this->super_BufferVerifierBase).super_CallLogWrapper,0xbe2);
  glu::CallLogWrapper::glBlendFunc(&(this->super_BufferVerifierBase).super_CallLogWrapper,1,1);
  glu::CallLogWrapper::glBlendEquation
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8006);
  do {
    if (iVar10 <= numRemaining) break;
    local_324 = iVar10 - numRemaining;
    bVar2 = 1 < local_324;
    if (bVar2) {
      local_26c = de::min<int>(0x81,local_324);
    }
    else {
      local_26c = 2;
    }
    imageSetDesc.field_2._12_4_ = local_26c;
    if (bVar2) {
      local_274 = numRemaining;
    }
    else {
      local_274 = iVar10 + -2;
    }
    imageSetDesc.field_2._8_4_ = local_274;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Bytes ",&local_189);
    local_1b4 = iVar9 + imageSetDesc.field_2._8_4_;
    de::toString<int>(&local_1b0,&local_1b4);
    std::operator+(&local_168,&local_188,&local_1b0);
    std::operator+(&local_148,&local_168," to ");
    local_1dc = imageSetDesc.field_2._12_4_ + -1 + iVar9 + imageSetDesc.field_2._8_4_;
    de::toString<int>(&local_1d8,&local_1dc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_148,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    glu::CallLogWrapper::glClear(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,this->m_positionBuf);
    this_00 = &colors.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       this_00);
    pvVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        this_00,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,sVar6 << 3,pvVar7,
               0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_posLoc,2,0x1406,'\0',0
               ,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,this->m_colorBuf);
    this_01 = &fetchedPos.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       this_01);
    pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        this_01,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,sVar6 * 0xc,pvVar8,
               0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_colorLoc,3,0x1406,'\0'
               ,0,(void *)0x0);
    glu::CallLogWrapper::glDrawElements
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,3,imageSetDesc.field_2._12_4_,
               0x1401,(void *)(long)(iVar9 + imageSetDesc.field_2._8_4_));
    pRVar1 = (this->super_BufferVerifierBase).m_renderCtx;
    tcu::Surface::getAccess(&local_208,(Surface *)&referenceImg.m_pixels.m_cap);
    glu::readPixels(pRVar1,0,0,&local_208);
    pvVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_88,0);
    src = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &colors.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    execVertexFetch<tcu::Vector<float,2>>
              (pvVar7,src,sig + (long)(int)imageSetDesc.field_2._8_4_ + (long)iVar9,
               imageSetDesc.field_2._12_4_);
    pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_b8,0);
    src_00 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        &fetchedPos.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    execVertexFetch<tcu::Vector<float,3>>
              (pvVar8,src_00,sig + (long)(int)imageSetDesc.field_2._8_4_ + (long)iVar9,
               imageSetDesc.field_2._12_4_);
    glu::CallLogWrapper::glClear(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,this->m_positionBuf);
    sVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       local_88);
    pvVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_88,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,sVar6 << 3,pvVar7,
               0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_posLoc,2,0x1406,'\0',0
               ,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,this->m_colorBuf);
    sVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       local_b8);
    pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_b8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,sVar6 * 0xc,pvVar8,
               0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_colorLoc,3,0x1406,'\0'
               ,0,(void *)0x0);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,3,0,
               imageSetDesc.field_2._12_4_);
    pRVar1 = (this->super_BufferVerifierBase).m_renderCtx;
    tcu::Surface::getAccess(&local_230,(Surface *)local_f0);
    glu::readPixels(pRVar1,0,0,&local_230);
    log = (this->super_BufferVerifierBase).m_log;
    imageSetDesc_00 = (char *)std::__cxx11::string::c_str();
    bVar3 = tcu::pixelThresholdCompare
                      (log,"RenderResult",imageSetDesc_00,(Surface *)local_f0,
                       (Surface *)&referenceImg.m_pixels.m_cap,
                       (RGBA *)&positions.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       COMPARE_LOG_RESULT);
    if (bVar3) {
      if (bVar2) {
        local_324 = imageSetDesc.field_2._12_4_;
      }
      numRemaining = local_324 + numRemaining;
      local_234 = 0;
    }
    else {
      isLeftoverBatch = false;
      local_234 = 3;
    }
    std::__cxx11::string::~string((string *)local_128);
  } while (local_234 == 0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_BufferVerifierBase).super_CallLogWrapper,0);
  tcu::Surface::~Surface((Surface *)local_f0);
  tcu::Surface::~Surface((Surface *)&referenceImg.m_pixels.m_cap);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_b8);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_88);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
             &fetchedPos.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),isLeftoverBatch);
}

Assistant:

bool IndexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_renderCtx.getRenderTarget();
	const int					viewportW			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_WIDTH, renderTarget.getWidth());
	const int					viewportH			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_HEIGHT, renderTarget.getHeight());
	const int					minBytesPerBatch	= 2;
	const tcu::RGBA				threshold			(0,0,0,0);

	std::vector<tcu::Vec2>		positions;
	std::vector<tcu::Vec3>		colors;

	std::vector<tcu::Vec2>		fetchedPos			(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);
	std::vector<tcu::Vec3>		fetchedColor		(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);

	tcu::Surface				indexBufferImg		(viewportW, viewportH);
	tcu::Surface				referenceImg		(viewportW, viewportH);

	int							numVerified			= 0;
	bool						isOk				= true;

	DE_STATIC_ASSERT(sizeof(tcu::Vec2) == sizeof(float)*2);
	DE_STATIC_ASSERT(sizeof(tcu::Vec3) == sizeof(float)*3);

	computeIndexVerifierPositions(positions);
	computeIndexVerifierColors(colors);

	// Reset buffer bindings.
	glBindVertexArray			(m_vao);
	glBindBuffer				(GL_PIXEL_PACK_BUFFER,		0);
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	buffer);

	// Setup rendering state.
	glViewport					(0, 0, viewportW, viewportH);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(m_posLoc);
	glEnableVertexAttribArray	(m_colorLoc);
	glEnable					(GL_BLEND);
	glBlendFunc					(GL_ONE, GL_ONE);
	glBlendEquation				(GL_FUNC_ADD);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < minBytesPerBatch;
		int		numBytesToVerify	= isLeftoverBatch ? minBytesPerBatch			: de::min(MAX_LINES_PER_INDEX_ARRAY_DRAW+1, numRemaining);
		int		curOffset			= isLeftoverBatch ? (numBytes-minBytesPerBatch)	: numVerified;
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		// Step 1: Render using index buffer.
		glClear					(GL_COLOR_BUFFER_BIT);

		glBindBuffer			(GL_ARRAY_BUFFER, m_positionBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(positions.size()*sizeof(positions[0])), &positions[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glBindBuffer			(GL_ARRAY_BUFFER, m_colorBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(colors.size()*sizeof(colors[0])), &colors[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glDrawElements			(GL_LINE_STRIP, numBytesToVerify, GL_UNSIGNED_BYTE, (void*)(deUintptr)(offset+curOffset));
		glu::readPixels			(m_renderCtx, 0, 0, indexBufferImg.getAccess());

		// Step 2: Do manual fetch and render without index buffer.
		execVertexFetch(&fetchedPos[0], &positions[0], refPtr+offset+curOffset, numBytesToVerify);
		execVertexFetch(&fetchedColor[0], &colors[0], refPtr+offset+curOffset, numBytesToVerify);

		glClear					(GL_COLOR_BUFFER_BIT);

		glBindBuffer			(GL_ARRAY_BUFFER, m_positionBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(fetchedPos.size()*sizeof(fetchedPos[0])), &fetchedPos[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glBindBuffer			(GL_ARRAY_BUFFER, m_colorBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(fetchedColor.size()*sizeof(fetchedColor[0])), &fetchedColor[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glDrawArrays			(GL_LINE_STRIP, 0, numBytesToVerify);
		glu::readPixels			(m_renderCtx, 0, 0, referenceImg.getAccess());

		if (!tcu::pixelThresholdCompare(m_log, "RenderResult", imageSetDesc.c_str(), referenceImg, indexBufferImg, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glBindVertexArray(0);

	return isOk;
}